

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_next(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlChar *local_58;
  xmlNsPtr ns;
  xmlAttrPtr attr;
  xmlNodePtr res;
  xmlNodePtr cur;
  PyObject *obj;
  PyObject *resultobj;
  PyObject *args_local;
  PyObject *self_local;
  
  resultobj = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:next",&cur);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (cur == (xmlNodePtr)&_Py_NoneStruct) {
      local_58 = (xmlChar *)0x0;
    }
    else {
      local_58 = cur->name;
    }
    switch(*(undefined4 *)(local_58 + 8)) {
    case 2:
      attr = *(xmlAttrPtr *)(local_58 + 0x30);
      break;
    default:
      attr = *(xmlAttrPtr *)(local_58 + 0x30);
      break;
    case 9:
    case 0xd:
      attr = (xmlAttrPtr)0x0;
      break;
    case 0x12:
      attr = *(xmlAttrPtr *)local_58;
    }
    self_local = libxml_xmlNodePtrWrap((xmlNodePtr)attr);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_next(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    xmlNodePtr res;

    if (!PyArg_ParseTuple(args, (char *) "O:next", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);

    switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            res = NULL;
            break;
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;

                res = (xmlNodePtr) attr->next;
                break;
            }
        case XML_NAMESPACE_DECL:{
                xmlNsPtr ns = (xmlNsPtr) cur;

                res = (xmlNodePtr) ns->next;
                break;
            }
        default:
            res = cur->next;
            break;

    }
    resultobj = libxml_xmlNodePtrWrap(res);
    return resultobj;
}